

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

int __thiscall
InitSocket::CbEnumIpAdressen
          (InitSocket *this,int iFamily,string *strIp,int nInterFaceId,void *vpUserParam)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  local_90;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  local_68;
  void *local_40;
  vector<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *pmaStrIps;
  void *vpUserParam_local;
  string *psStack_28;
  int nInterFaceId_local;
  string *strIp_local;
  InitSocket *pIStack_18;
  int iFamily_local;
  InitSocket *this_local;
  
  if (vpUserParam != (void *)0x0) {
    local_40 = vpUserParam;
    pmaStrIps = (vector<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                 *)vpUserParam;
    vpUserParam_local._4_4_ = nInterFaceId;
    psStack_28 = strIp;
    strIp_local._4_4_ = iFamily;
    pIStack_18 = this;
    std::make_tuple<std::__cxx11::string_const&,int&,int&>
              (&local_90,strIp,(int *)((long)&strIp_local + 4),(int *)((long)&vpUserParam_local + 4)
              );
    std::
    tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int,_true,_true>
              (&local_68,&local_90);
    std::
    vector<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::push_back((vector<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                 *)vpUserParam,&local_68);
    std::
    tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ::~tuple(&local_68);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ::~tuple(&local_90);
  }
  this_local._4_4_ = (uint)(vpUserParam == (void *)0x0);
  return this_local._4_4_;
}

Assistant:

int InitSocket::CbEnumIpAdressen(int iFamily, const string& strIp, int nInterFaceId, void* vpUserParam)
{
    if (vpUserParam == nullptr)
        return 1;   // Stop enumeration, doesn't make sense

    vector<tuple<const string, int, int>>* pmaStrIps = static_cast<vector<tuple<const string, int, int>>*>(vpUserParam);
    pmaStrIps->push_back(make_tuple(strIp, iFamily, nInterFaceId));

    return 0;
}